

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void remove_dev(lys_deviation *dev,lys_module *module)

{
  byte bVar1;
  char *__needle;
  lys_module *plVar2;
  char *pcVar3;
  size_t sVar4;
  LY_ERR *pLVar5;
  lys_module *plVar6;
  long lVar7;
  uint32_t local_34 [2];
  uint32_t idx;
  
  local_34[0] = 0;
  if (dev->orig_node == (lys_node *)0x0) {
    pLVar5 = ly_errno_location();
    *pLVar5 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
           ,0x1080);
    return;
  }
  plVar6 = dev->orig_node->module;
  if ((plVar6->field_0x40 & 1) != 0) {
    plVar6 = (lys_module *)plVar6->data;
  }
  lys_switch_deviation(dev,module);
  do {
    do {
      plVar2 = ly_ctx_get_module_iter(module->ctx,local_34);
      if (plVar2 == (lys_module *)0x0) {
        plVar6->field_0x40 = plVar6->field_0x40 & 0xcf;
        return;
      }
    } while ((plVar2 == module) || (plVar2 == plVar6));
    bVar1 = plVar2->deviation_size;
    for (lVar7 = 0; (ulong)bVar1 * 0x38 != lVar7; lVar7 = lVar7 + 0x38) {
      __needle = plVar6->name;
      pcVar3 = strstr(*(char **)((long)&plVar2->deviation->target_name + lVar7),__needle);
      if ((pcVar3 != (char *)0x0) && (sVar4 = strlen(__needle), pcVar3[sVar4] == ':')) {
        return;
      }
    }
  } while( true );
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
    } else {
        LOGINT;
        return;
    }
    lys_switch_deviation(dev, module);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;
    }
}